

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderGeneric.cpp
# Opt level: O3

vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
* __thiscall
adios2::core::engine::ssc::SscReaderGeneric::BlocksInfo
          (vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
           *__return_storage_ptr__,SscReaderGeneric *this,VariableStruct *variable,size_t step)

{
  pointer pBVar1;
  size_t __n;
  iterator __position;
  size_t sVar2;
  int iVar3;
  pointer pvVar4;
  pointer pvVar5;
  size_t sVar6;
  long lVar7;
  BPInfo *pBVar8;
  BlockInfo *v;
  pointer pBVar9;
  
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar4 = (this->m_GlobalWritePattern).
           super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (this->m_GlobalWritePattern).
           super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pvVar5 - (long)pvVar4) >> 3) * -0x55555555) {
    lVar7 = 0;
    sVar6 = 0;
    do {
      pBVar9 = pvVar4[lVar7].
               super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pBVar1 = *(pointer *)
                ((long)&pvVar4[lVar7].
                        super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
                        ._M_impl.super__Vector_impl_data + 8);
      if (pBVar9 != pBVar1) {
        do {
          __n = (pBVar9->name)._M_string_length;
          if (__n == *(size_t *)(variable + 0x10)) {
            if (__n != 0) {
              iVar3 = bcmp((pBVar9->name)._M_dataplus._M_p,*(void **)(variable + 8),__n);
              if (iVar3 != 0) goto LAB_00147e7c;
            }
            __position._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
              ::_M_realloc_insert<>(__return_storage_ptr__,__position);
              pBVar8 = (__return_storage_ptr__->
                       super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              memset(__position._M_current,0,0xd0);
              (__position._M_current)->MemSpace = Host;
              pBVar8 = __position._M_current + 1;
              (__return_storage_ptr__->
              super__Vector_base<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
              )._M_impl.super__Vector_impl_data._M_finish = pBVar8;
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      (&pBVar8[-1].Start,&pBVar9->start);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      (&pBVar8[-1].Count,&pBVar9->count);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      (&pBVar8[-1].Shape,&pBVar9->shape);
            sVar2 = (this->super_SscReaderBase).m_CurrentStep;
            pBVar8[-1].Step = sVar2;
            pBVar8[-1].StepsStart = sVar2;
            pBVar8[-1].StepsCount = 1;
            pBVar8[-1].WriterID = (int)lVar7;
            pBVar8[-1].BlockID = sVar6;
            if (*(int *)((this->super_SscReaderBase).m_IO + 0x58) != 0) {
              pBVar8[-1].IsReverseDims = true;
            }
            sVar6 = sVar6 + 1;
          }
LAB_00147e7c:
          pBVar9 = pBVar9 + 1;
        } while (pBVar9 != pBVar1);
        pvVar4 = (this->m_GlobalWritePattern).
                 super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar5 = (this->m_GlobalWritePattern).
                 super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)((ulong)((long)pvVar5 - (long)pvVar4) >> 3) * -0x55555555);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VariableStruct::BPInfo> SscReaderGeneric::BlocksInfo(const VariableStruct &variable,
                                                                 const size_t step) const
{
    std::vector<VariableStruct::BPInfo> ret;
    size_t blockID = 0;
    for (int i = 0; i < static_cast<int>(m_GlobalWritePattern.size()); ++i)
    {
        for (auto &v : m_GlobalWritePattern[i])
        {
            if (v.name == variable.m_Name)
            {
                ret.emplace_back();
                auto &b = ret.back();
                b.Start = v.start;
                b.Count = v.count;
                b.Shape = v.shape;
                b.Step = m_CurrentStep;
                b.StepsStart = m_CurrentStep;
                b.StepsCount = 1;
                b.WriterID = i;
                b.BlockID = blockID;
                if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
                {
                    b.IsReverseDims = true;
                }
                ++blockID;
            }
        }
    }
    return ret;
}